

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O3

void __thiscall duckdb::Binder::BindGeneratedColumns(Binder *this,BoundCreateTableInfo *info)

{
  ExpressionBinder *this_00;
  pointer pCVar1;
  pointer pcVar2;
  int iVar3;
  ColumnList *pCVar4;
  ColumnDefinition *pCVar5;
  string *psVar6;
  LogicalType *pLVar7;
  idx_t index;
  Binder *pBVar8;
  type binder_00;
  size_type sVar9;
  ParsedExpression *pPVar10;
  pointer pEVar11;
  reference pvVar12;
  BinderException *this_01;
  pointer alias;
  pointer puVar13;
  ColumnListIterator CVar14;
  value_type i;
  shared_ptr<duckdb::Binder,_true> binder;
  optional_ptr<duckdb::Binding,_true> table_binding;
  vector<duckdb::LogicalType,_true> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  stack<duckdb::LogicalIndex,_std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
  bind_order;
  ErrorData ignore;
  logical_index_set_t bound_indices;
  ExpressionBinder expr_binder;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_288;
  Binder *local_280;
  undefined1 local_278 [32];
  long *local_258;
  __node_base local_250;
  vector<duckdb::LogicalType,_true> local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_228;
  BoundCreateTableInfo *local_210;
  pointer local_208;
  string local_200;
  _Any_data local_1e0;
  code *local_1d0;
  _Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> local_1c0;
  undefined1 local_170 [16];
  pointer local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  __node_base_ptr local_138 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_128 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [56];
  ExpressionBinder local_98;
  
  local_280 = this;
  local_210 = info;
  local_208 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(&info->base);
  local_228.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._16_8_ = &local_208[1].catalog.field_2;
  CVar14 = ColumnList::Logical((ColumnList *)local_278._16_8_);
  pCVar4 = CVar14.list;
  local_170[8] = CVar14.physical;
  if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar1 = (pCVar4->columns).
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_158._M_allocated_capacity =
         ((long)pCVar1 -
          (long)(pCVar4->columns).
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    puVar13 = (pointer)(((long)pCVar1 -
                         (long)(pCVar4->columns).
                               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               .
                               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed
                       );
  }
  else {
    puVar13 = (pointer)((long)(pCVar4->physical_columns).
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar4->physical_columns).
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3);
    local_158._M_allocated_capacity = (size_type)puVar13;
  }
  local_160 = (pointer)0x0;
  local_170._0_8_ = pCVar4;
  while (((pBVar8 = local_280, local_160 != puVar13 ||
          ((pointer)local_158._M_allocated_capacity != puVar13)) ||
         ((ColumnList *)local_170._0_8_ != pCVar4))) {
    pCVar5 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                       ((ColumnLogicalIteratorInternal *)local_170);
    psVar6 = ColumnDefinition::Name_abi_cxx11_(pCVar5);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_228,psVar6);
    pLVar7 = ColumnDefinition::Type(pCVar5);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_248,
               pLVar7);
    local_160 = (pointer)((long)&(local_160->
                                 super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>
                                 )._M_t.
                                 super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>
                                 .super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>.
                                 _M_head_impl + 1);
  }
  index = GenerateTableIndex(local_280);
  CreateBinder((Binder *)local_278,pBVar8->context,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
  pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_278);
  CatalogEntryRetriever::GetCallback
            ((catalog_entry_callback_t *)&local_1e0,&local_280->entry_retriever);
  SetCatalogLookupCallback(pBVar8,(catalog_entry_callback_t *)&local_1e0);
  if (local_1d0 != (code *)0x0) {
    (*local_1d0)(&local_1e0,&local_1e0,__destroy_functor);
  }
  pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_278);
  alias = local_208 + 1;
  BindContext::AddGenericBinding(&pBVar8->bind_context,index,(string *)alias,&local_228,&local_248);
  binder_00 = shared_ptr<duckdb::Binder,_true>::operator*
                        ((shared_ptr<duckdb::Binder,_true> *)local_278);
  ExpressionBinder::ExpressionBinder(&local_98,binder_00,local_280->context,false);
  ErrorData::ErrorData((ErrorData *)local_170);
  pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_278);
  local_250._M_nxt =
       (_Hash_node_base *)
       BindContext::GetBinding(&pBVar8->bind_context,(string *)alias,(ErrorData *)local_170);
  ColumnDependencyManager::GetBindOrder
            ((stack<duckdb::LogicalIndex,_std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
              *)&local_1c0,&local_210->column_dependency_manager,(ColumnList *)local_278._16_8_);
  local_d0._0_8_ = local_d0 + 0x30;
  local_d0._8_8_ = &DAT_00000001;
  local_d0._16_8_ = (_Hash_node_base *)0x0;
  local_d0._24_8_ = 0;
  local_d0._32_4_ = 1.0;
  local_d0._40_8_ = 0;
  local_d0._48_8_ = (__node_base_ptr)0x0;
  if (local_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1c0._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = (ExpressionBinder *)(local_278 + 0x18);
    do {
      if (local_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c0._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_288._M_head_impl =
             (Binding *)local_1c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f].index;
        operator_delete(local_1c0._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_1c0._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_1c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_1c0._M_impl.super__Deque_impl_data._M_finish._M_last =
             (_Elt_pointer)
             ((_Hash_node_base *)local_1c0._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40)
        ;
        local_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             ((_Hash_node_base *)local_1c0._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f)
        ;
        local_1c0._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_1c0._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_288._M_head_impl =
             (((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_> *)
              &((_Hash_node_base *)(local_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur + -1))
               ->_M_nxt)->_M_t).
             super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
             super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl;
        local_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      pCVar5 = ColumnList::GetColumnMutable
                         ((ColumnList *)local_278._16_8_,(LogicalIndex)local_288._M_head_impl);
      sVar9 = ::std::
              _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_d0,(key_type *)&local_288);
      if (sVar9 == 0) {
        pPVar10 = ColumnDefinition::GeneratedExpression(pCVar5);
        (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])
                  ((LogicalType *)&local_258,pPVar10);
        ExpressionBinder::Bind
                  (this_00,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)&local_98,(LogicalType *)&local_258,false);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)this_00);
        iVar3 = (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[4])(pEVar11);
        if ((char)iVar3 != '\0') {
          this_01 = (BinderException *)__cxa_allocate_exception(0x10);
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_200,
                     "Failed to bind generated column \'%s\' because the expression contains a subquery"
                     ,"");
          psVar6 = ColumnDefinition::Name_abi_cxx11_(pCVar5);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          pcVar2 = (psVar6->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar2,pcVar2 + psVar6->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>(this_01,&local_200,&local_f0);
          __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pLVar7 = ColumnDefinition::Type(pCVar5);
        if (pLVar7->id_ == ANY) {
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)this_00);
          ColumnDefinition::ChangeGeneratedExpressionType(pCVar5,&pEVar11->return_type);
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)this_00);
          ColumnDefinition::SetType(pCVar5,&pEVar11->return_type);
          pLVar7 = ColumnDefinition::Type(pCVar5);
          optional_ptr<duckdb::Binding,_true>::CheckValid
                    ((optional_ptr<duckdb::Binding,_true> *)&local_250);
          pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)(local_250._M_nxt + 0xf),
                               (size_type)local_288._M_head_impl);
          if (pvVar12 != pLVar7) {
            pvVar12->id_ = pLVar7->id_;
            pvVar12->physical_type_ = pLVar7->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&pvVar12->type_info_,&pLVar7->type_info_);
          }
        }
        local_200._M_dataplus._M_p = (pointer)local_d0;
        ::std::
        _Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::LogicalIndex_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalIndex,true>>>>
                  ((_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_d0,&local_288,&local_200);
        if ((__buckets_ptr)local_278._24_8_ != (__buckets_ptr)0x0) {
          (*(code *)(*(__node_base_ptr *)local_278._24_8_)[1]._M_nxt)();
        }
        if (local_258 != (long *)0x0) {
          (**(code **)(*local_258 + 8))();
        }
      }
    } while (local_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_1c0._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ::std::
  _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_d0);
  ::std::_Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::~_Deque_base
            (&local_1c0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_128);
  if ((__node_base_ptr *)local_148._M_p != local_138) {
    operator_delete(local_148._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_170._9_7_,local_170[8]) != &local_158) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_170._9_7_,local_170[8]));
  }
  ExpressionBinder::~ExpressionBinder(&local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_248);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_228);
  return;
}

Assistant:

void Binder::BindGeneratedColumns(BoundCreateTableInfo &info) {
	auto &base = info.base->Cast<CreateTableInfo>();

	vector<string> names;
	vector<LogicalType> types;

	D_ASSERT(base.type == CatalogType::TABLE_ENTRY);
	for (auto &col : base.columns.Logical()) {
		names.push_back(col.Name());
		types.push_back(col.Type());
	}
	auto table_index = GenerateTableIndex();

	// Create a new binder because we dont need (or want) these bindings in this scope
	auto binder = Binder::CreateBinder(context);
	binder->SetCatalogLookupCallback(entry_retriever.GetCallback());
	binder->bind_context.AddGenericBinding(table_index, base.table, names, types);
	auto expr_binder = ExpressionBinder(*binder, context);
	ErrorData ignore;
	auto table_binding = binder->bind_context.GetBinding(base.table, ignore);
	D_ASSERT(table_binding && !ignore.HasError());

	auto bind_order = info.column_dependency_manager.GetBindOrder(base.columns);
	logical_index_set_t bound_indices;

	while (!bind_order.empty()) {
		auto i = bind_order.top();
		bind_order.pop();
		auto &col = base.columns.GetColumnMutable(i);

		//! Already bound this previously
		//! This can not be optimized out of the GetBindOrder function
		//! These occurrences happen because we need to make sure that ALL dependencies of a column are resolved before
		//! it gets resolved
		if (bound_indices.count(i)) {
			continue;
		}
		D_ASSERT(col.Generated());
		auto expression = col.GeneratedExpression().Copy();

		auto bound_expression = expr_binder.Bind(expression);
		D_ASSERT(bound_expression);
		if (bound_expression->HasSubquery()) {
			throw BinderException("Failed to bind generated column '%s' because the expression contains a subquery",
			                      col.Name());
		}
		if (col.Type().id() == LogicalTypeId::ANY) {
			// Do this before changing the type, so we know it's the first time the type is set
			col.ChangeGeneratedExpressionType(bound_expression->return_type);
			col.SetType(bound_expression->return_type);

			// Update the type in the binding, for future expansions
			table_binding->types[i.index] = col.Type();
		}
		bound_indices.insert(i);
	}
}